

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::SubGridIntersectorKMoeller<8,_4,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Geometry *pGVar6;
  long lVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  ulong *puVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  long lVar29;
  ulong uVar30;
  ulong *puVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  Geometry *geometry;
  long lVar41;
  ulong *puVar42;
  ulong uVar43;
  bool bVar44;
  bool bVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  float fVar64;
  float fVar69;
  float fVar70;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar71;
  undefined1 auVar68 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  float fVar83;
  float fVar84;
  float fVar85;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  uint uVar86;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  RTCFilterFunctionNArguments args;
  MoellerTrumboreHitM<8,_embree::avx512::UVIdentity<8>_> hit;
  NodeRef stack [564];
  ulong *local_1618;
  ulong local_1608;
  undefined8 local_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  ulong local_15d0;
  ulong local_15c8;
  ulong local_15c0;
  ulong local_15b8;
  ulong local_15b0;
  ulong local_15a8;
  ulong *local_15a0;
  ulong local_1598;
  ulong local_1590;
  ulong local_1588;
  ulong local_1580;
  ulong local_1578;
  ulong local_1570;
  ulong local_1568;
  ulong local_1560;
  long local_1558;
  RTCFilterFunctionNArguments local_1550;
  undefined1 local_1520 [16];
  undefined1 local_1510 [16];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined4 local_13f0;
  undefined4 uStack_13ec;
  undefined4 uStack_13e8;
  undefined4 uStack_13e4;
  undefined4 local_13e0;
  undefined4 uStack_13dc;
  undefined4 uStack_13d8;
  undefined4 uStack_13d4;
  undefined4 local_13d0;
  undefined4 uStack_13cc;
  undefined4 uStack_13c8;
  undefined4 uStack_13c4;
  float local_13c0;
  float fStack_13bc;
  float fStack_13b8;
  float fStack_13b4;
  float local_13b0;
  float fStack_13ac;
  float fStack_13a8;
  float fStack_13a4;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined1 local_1390 [16];
  uint local_1380;
  uint uStack_137c;
  uint uStack_1378;
  uint uStack_1374;
  uint uStack_1370;
  uint uStack_136c;
  uint uStack_1368;
  uint uStack_1364;
  float local_1360;
  float fStack_135c;
  float fStack_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float fStack_1348;
  float fStack_1344;
  float local_1340;
  float fStack_133c;
  float fStack_1338;
  float fStack_1334;
  float fStack_1330;
  float fStack_132c;
  float fStack_1328;
  float fStack_1324;
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  byte local_12df;
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  float local_1280 [4];
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  undefined4 uStack_1264;
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_15a0 = local_11f8;
  local_1200 = root.ptr;
  auVar47 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar89 = ZEXT3264(auVar47);
  auVar48 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar90 = ZEXT3264(auVar48);
  auVar49 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar91 = ZEXT3264(auVar49);
  auVar46 = vmulss_avx512f(auVar47._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar50._0_4_ = auVar46._0_4_;
  auVar50._4_4_ = auVar50._0_4_;
  auVar50._8_4_ = auVar50._0_4_;
  auVar50._12_4_ = auVar50._0_4_;
  auVar50._16_4_ = auVar50._0_4_;
  auVar50._20_4_ = auVar50._0_4_;
  auVar50._24_4_ = auVar50._0_4_;
  auVar50._28_4_ = auVar50._0_4_;
  auVar46 = vmulss_avx512f(auVar48._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar60._0_4_ = auVar46._0_4_;
  auVar60._4_4_ = auVar60._0_4_;
  auVar60._8_4_ = auVar60._0_4_;
  auVar60._12_4_ = auVar60._0_4_;
  auVar60._16_4_ = auVar60._0_4_;
  auVar60._20_4_ = auVar60._0_4_;
  auVar60._24_4_ = auVar60._0_4_;
  auVar60._28_4_ = auVar60._0_4_;
  auVar46 = vmulss_avx512f(auVar49._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar49._0_4_ = auVar46._0_4_;
  auVar49._4_4_ = auVar49._0_4_;
  auVar49._8_4_ = auVar49._0_4_;
  auVar49._12_4_ = auVar49._0_4_;
  auVar49._16_4_ = auVar49._0_4_;
  auVar49._20_4_ = auVar49._0_4_;
  auVar49._24_4_ = auVar49._0_4_;
  auVar49._28_4_ = auVar49._0_4_;
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar36 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar38 = uVar35 ^ 0x20;
  uVar39 = uVar36 ^ 0x20;
  uVar43 = uVar37 ^ 0x20;
  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar92 = ZEXT3264(auVar47);
  auVar48 = vxorps_avx512vl(auVar50,auVar47);
  auVar93 = ZEXT3264(auVar48);
  auVar48 = vxorps_avx512vl(auVar60,auVar47);
  auVar94 = ZEXT3264(auVar48);
  auVar47 = vxorps_avx512vl(auVar49,auVar47);
  auVar95 = ZEXT3264(auVar47);
  auVar47 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar96 = ZEXT3264(auVar47);
  auVar47 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar97 = ZEXT3264(auVar47);
  local_1570 = uVar35 >> 2;
  local_1578 = uVar38 >> 2;
  local_1580 = uVar36 >> 2;
  local_1588 = uVar39 >> 2;
  local_1590 = uVar37 >> 2;
  local_1598 = uVar43 >> 2;
  auVar46 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
  auVar98 = ZEXT1664(auVar46);
  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar99 = ZEXT3264(auVar47);
  local_1510 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  puVar42 = local_15a0;
  local_15d0 = uVar43;
  local_15c8 = uVar39;
  local_15c0 = uVar38;
  local_15b8 = uVar37;
  local_15b0 = uVar36;
  local_15a8 = uVar35;
  do {
    puVar31 = puVar42;
    if (puVar31 == &local_1200) break;
    local_1618 = puVar31 + -1;
    uVar33 = puVar31[-1];
    do {
      if ((uVar33 & 8) == 0) {
        auVar47 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar33 + 0x40 + uVar35),auVar93._0_32_,
                             auVar89._0_32_);
        auVar48 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar33 + 0x40 + uVar36),auVar94._0_32_,
                             auVar90._0_32_);
        auVar47 = vpmaxsd_avx2(auVar47,auVar48);
        auVar49 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar33 + 0x40 + uVar37),auVar95._0_32_,
                             auVar91._0_32_);
        auVar48 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar33 + 0x40 + uVar38),auVar93._0_32_,
                             auVar89._0_32_);
        auVar50 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar33 + 0x40 + uVar39),auVar94._0_32_,
                             auVar90._0_32_);
        auVar48 = vpminsd_avx2(auVar48,auVar50);
        auVar50 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar33 + 0x40 + uVar43),auVar95._0_32_,
                             auVar91._0_32_);
        auVar49 = vpmaxsd_avx512vl(auVar49,auVar96._0_32_);
        auVar47 = vpmaxsd_avx2(auVar47,auVar49);
        auVar49 = vpminsd_avx512vl(auVar50,auVar97._0_32_);
        auVar48 = vpminsd_avx2(auVar48,auVar49);
        uVar20 = vpcmpd_avx512vl(auVar47,auVar48,2);
        local_15a0 = (ulong *)CONCAT44((int)((ulong)local_15a0 >> 0x20),(uint)(byte)uVar20);
      }
      if ((uVar33 & 8) == 0) {
        if (local_15a0 == (ulong *)0x0) {
          uVar86 = 4;
        }
        else {
          uVar32 = uVar33 & 0xfffffffffffffff0;
          lVar29 = 0;
          for (puVar42 = local_15a0; ((ulong)puVar42 & 1) == 0;
              puVar42 = (ulong *)((ulong)puVar42 >> 1 | 0x8000000000000000)) {
            lVar29 = lVar29 + 1;
          }
          uVar86 = 0;
          uVar30 = (long)local_15a0 - 1U & (ulong)local_15a0;
          uVar33 = *(ulong *)(uVar32 + lVar29 * 8);
          if (uVar30 != 0) {
            *local_1618 = uVar33;
            lVar29 = 0;
            for (uVar33 = uVar30; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
              lVar29 = lVar29 + 1;
            }
            uVar33 = *(ulong *)(uVar32 + lVar29 * 8);
            for (uVar30 = uVar30 - 1 & uVar30; local_1618 = local_1618 + 1, uVar30 != 0;
                uVar30 = uVar30 - 1 & uVar30) {
              *local_1618 = uVar33;
              lVar29 = 0;
              for (uVar33 = uVar30; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
                lVar29 = lVar29 + 1;
              }
              uVar33 = *(ulong *)(uVar32 + lVar29 * 8);
            }
          }
        }
      }
      else {
        uVar86 = 6;
      }
    } while (uVar86 == 0);
    if (uVar86 == 6) {
      local_1568 = (ulong)((uint)uVar33 & 0xf) - 8;
      bVar44 = local_1568 != 0;
      if (bVar44) {
        uVar33 = uVar33 & 0xfffffffffffffff0;
        local_1560 = 0;
        puVar42 = puVar31;
        do {
          lVar29 = local_1560 * 0x90;
          local_1558 = uVar33 + lVar29;
          auVar61._8_8_ = 0;
          auVar61._0_8_ = *(ulong *)(uVar33 + 0x40 + lVar29);
          auVar65._8_8_ = 0;
          auVar65._0_8_ = *(ulong *)(uVar33 + 0x48 + lVar29);
          uVar20 = vpcmpub_avx512vl(auVar61,auVar65,2);
          uVar1 = *(undefined4 *)(uVar33 + 0x70 + lVar29);
          auVar48._4_4_ = uVar1;
          auVar48._0_4_ = uVar1;
          auVar48._8_4_ = uVar1;
          auVar48._12_4_ = uVar1;
          auVar48._16_4_ = uVar1;
          auVar48._20_4_ = uVar1;
          auVar48._24_4_ = uVar1;
          auVar48._28_4_ = uVar1;
          uVar1 = *(undefined4 *)(uVar33 + 0x7c + lVar29);
          auVar53._4_4_ = uVar1;
          auVar53._0_4_ = uVar1;
          auVar53._8_4_ = uVar1;
          auVar53._12_4_ = uVar1;
          auVar53._16_4_ = uVar1;
          auVar53._20_4_ = uVar1;
          auVar53._24_4_ = uVar1;
          auVar53._28_4_ = uVar1;
          auVar46._8_8_ = 0;
          auVar46._0_8_ = *(ulong *)(local_1570 + 0x40 + local_1558);
          auVar47 = vpmovzxbd_avx2(auVar46);
          auVar47 = vcvtdq2ps_avx(auVar47);
          auVar46 = vfmadd213ps_fma(auVar47,auVar53,auVar48);
          auVar67._8_8_ = 0;
          auVar67._0_8_ = *(ulong *)(local_1578 + 0x40 + local_1558);
          auVar47 = vpmovzxbd_avx2(auVar67);
          auVar47 = vcvtdq2ps_avx(auVar47);
          auVar67 = vfmadd213ps_fma(auVar47,auVar53,auVar48);
          uVar1 = *(undefined4 *)(uVar33 + 0x74 + lVar29);
          auVar59._4_4_ = uVar1;
          auVar59._0_4_ = uVar1;
          auVar59._8_4_ = uVar1;
          auVar59._12_4_ = uVar1;
          auVar59._16_4_ = uVar1;
          auVar59._20_4_ = uVar1;
          auVar59._24_4_ = uVar1;
          auVar59._28_4_ = uVar1;
          uVar1 = *(undefined4 *)(uVar33 + 0x80 + lVar29);
          auVar55._4_4_ = uVar1;
          auVar55._0_4_ = uVar1;
          auVar55._8_4_ = uVar1;
          auVar55._12_4_ = uVar1;
          auVar55._16_4_ = uVar1;
          auVar55._20_4_ = uVar1;
          auVar55._24_4_ = uVar1;
          auVar55._28_4_ = uVar1;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *(ulong *)(local_1580 + 0x40 + local_1558);
          auVar47 = vpmovzxbd_avx2(auVar2);
          auVar47 = vcvtdq2ps_avx(auVar47);
          auVar2 = vfmadd213ps_fma(auVar47,auVar55,auVar59);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)(local_1588 + 0x40 + local_1558);
          auVar47 = vpmovzxbd_avx2(auVar3);
          auVar47 = vcvtdq2ps_avx(auVar47);
          auVar3 = vfmadd213ps_fma(auVar47,auVar55,auVar59);
          uVar1 = *(undefined4 *)(uVar33 + 0x78 + lVar29);
          auVar54._4_4_ = uVar1;
          auVar54._0_4_ = uVar1;
          auVar54._8_4_ = uVar1;
          auVar54._12_4_ = uVar1;
          auVar54._16_4_ = uVar1;
          auVar54._20_4_ = uVar1;
          auVar54._24_4_ = uVar1;
          auVar54._28_4_ = uVar1;
          uVar1 = *(undefined4 *)(uVar33 + 0x84 + lVar29);
          auVar51._4_4_ = uVar1;
          auVar51._0_4_ = uVar1;
          auVar51._8_4_ = uVar1;
          auVar51._12_4_ = uVar1;
          auVar51._16_4_ = uVar1;
          auVar51._20_4_ = uVar1;
          auVar51._24_4_ = uVar1;
          auVar51._28_4_ = uVar1;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)(local_1590 + 0x40 + local_1558);
          auVar47 = vpmovzxbd_avx2(auVar4);
          auVar47 = vcvtdq2ps_avx(auVar47);
          auVar4 = vfmadd213ps_fma(auVar47,auVar51,auVar54);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(ulong *)(local_1598 + 0x40 + local_1558);
          auVar47 = vpmovzxbd_avx2(auVar5);
          auVar47 = vcvtdq2ps_avx(auVar47);
          auVar5 = vfmadd213ps_fma(auVar47,auVar51,auVar54);
          auVar47 = vfmadd213ps_avx512vl(ZEXT1632(auVar46),auVar89._0_32_,auVar93._0_32_);
          auVar48 = vfmadd213ps_avx512vl(ZEXT1632(auVar2),auVar90._0_32_,auVar94._0_32_);
          auVar47 = vpmaxsd_avx2(auVar47,auVar48);
          auVar49 = vfmadd213ps_avx512vl(ZEXT1632(auVar4),auVar91._0_32_,auVar95._0_32_);
          auVar48 = vfmadd213ps_avx512vl(ZEXT1632(auVar67),auVar89._0_32_,auVar93._0_32_);
          auVar50 = vfmadd213ps_avx512vl(ZEXT1632(auVar3),auVar90._0_32_,auVar94._0_32_);
          auVar48 = vpminsd_avx2(auVar48,auVar50);
          auVar50 = vfmadd213ps_avx512vl(ZEXT1632(auVar5),auVar91._0_32_,auVar95._0_32_);
          auVar49 = vpmaxsd_avx512vl(auVar49,auVar96._0_32_);
          auVar47 = vpmaxsd_avx2(auVar47,auVar49);
          auVar49 = vpminsd_avx512vl(auVar50,auVar97._0_32_);
          auVar48 = vpminsd_avx2(auVar48,auVar49);
          uVar21 = vpcmpd_avx512vl(auVar47,auVar48,2);
          if ((byte)((byte)uVar21 & (byte)uVar20) != 0) {
            uVar35 = (ulong)(byte)((byte)uVar21 & (byte)uVar20);
            do {
              lVar29 = 0;
              for (uVar36 = uVar35; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
                lVar29 = lVar29 + 1;
              }
              pGVar6 = (context->scene->geometries).items[*(uint *)(local_1558 + 0x88)].ptr;
              lVar7 = *(long *)&pGVar6->field_0x58;
              lVar8 = *(long *)&pGVar6[1].time_range.upper;
              lVar34 = pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                       (ulong)*(uint *)(local_1558 + 4 + lVar29 * 8);
              uVar36 = *(ulong *)(local_1558 + lVar29 * 8);
              auVar62._8_8_ = 0;
              auVar62._0_8_ = uVar36;
              auVar46 = vpandq_avx512vl(auVar62,auVar98._0_16_);
              auVar5 = vpmovzxwd_avx(auVar46);
              auVar66._8_8_ = 0;
              auVar66._0_8_ = *(ulong *)(lVar7 + lVar34);
              auVar46 = vpaddd_avx(auVar66,auVar5);
              auVar67 = vpmulld_avx(auVar66,auVar5);
              auVar67 = vpsrlq_avx(auVar67,0x20);
              auVar46 = vpaddd_avx(auVar46,auVar67);
              lVar41 = CONCAT44((int)((ulong)puVar42 >> 0x20),auVar46._0_4_);
              p_Var9 = pGVar6[1].intersectionFilterN;
              auVar46 = *(undefined1 (*) [16])(lVar8 + (lVar41 + 1) * (long)p_Var9);
              uVar38 = *(ulong *)(lVar7 + lVar34) >> 0x20;
              lVar40 = uVar38 + lVar41 + 1;
              auVar67 = *(undefined1 (*) [16])(lVar8 + (uVar38 + lVar41) * (long)p_Var9);
              auVar2 = *(undefined1 (*) [16])(lVar8 + lVar40 * (long)p_Var9);
              uVar37 = (ulong)(-1 < (short)uVar36);
              auVar3 = *(undefined1 (*) [16])(lVar8 + (lVar41 + uVar37 + 1) * (long)p_Var9);
              lVar29 = uVar37 + lVar40;
              puVar42 = (ulong *)(lVar29 * (long)p_Var9);
              auVar4 = *(undefined1 (*) [16])(lVar8 + (long)puVar42);
              uVar37 = 0;
              if (-1 < (short)(uVar36 >> 0x10)) {
                uVar37 = uVar38;
              }
              auVar61 = *(undefined1 (*) [16])(lVar8 + (uVar38 + lVar41 + uVar37) * (long)p_Var9);
              auVar65 = *(undefined1 (*) [16])(lVar8 + (lVar40 + uVar37) * (long)p_Var9);
              auVar80._16_16_ = *(undefined1 (*) [16])(lVar8 + (uVar37 + lVar29) * (long)p_Var9);
              auVar80._0_16_ = auVar2;
              auVar66 = vunpcklps_avx(auVar46,auVar4);
              auVar62 = vunpckhps_avx(auVar46,auVar4);
              auVar14 = vunpcklps_avx(auVar3,auVar2);
              auVar3 = vunpckhps_avx(auVar3,auVar2);
              auVar15 = vunpcklps_avx(auVar62,auVar3);
              auVar16 = vunpcklps_avx(auVar66,auVar14);
              auVar3 = vunpckhps_avx(auVar66,auVar14);
              auVar66 = vunpcklps_avx(auVar67,auVar65);
              auVar62 = vunpckhps_avx(auVar67,auVar65);
              auVar14 = vunpcklps_avx(auVar2,auVar61);
              auVar61 = vunpckhps_avx(auVar2,auVar61);
              auVar62 = vunpcklps_avx(auVar62,auVar61);
              auVar17 = vunpcklps_avx(auVar66,auVar14);
              auVar61 = vunpckhps_avx(auVar66,auVar14);
              auVar75._16_16_ = auVar65;
              auVar75._0_16_ = auVar67;
              auVar72._16_16_ = auVar4;
              auVar72._0_16_ = auVar46;
              auVar47 = vunpcklps_avx(auVar72,auVar75);
              auVar68._16_16_ = auVar2;
              auVar68._0_16_ = *(undefined1 (*) [16])(lVar8 + (long)p_Var9 * lVar41);
              auVar48 = vunpcklps_avx(auVar68,auVar80);
              auVar53 = vunpcklps_avx(auVar48,auVar47);
              auVar54 = vunpckhps_avx(auVar48,auVar47);
              auVar47 = vunpckhps_avx(auVar72,auVar75);
              auVar48 = vunpckhps_avx(auVar68,auVar80);
              auVar55 = vunpcklps_avx(auVar48,auVar47);
              auVar47._16_16_ = auVar16;
              auVar47._0_16_ = auVar16;
              auVar74._16_16_ = auVar3;
              auVar74._0_16_ = auVar3;
              auVar76._16_16_ = auVar15;
              auVar76._0_16_ = auVar15;
              auVar77._16_16_ = auVar17;
              auVar77._0_16_ = auVar17;
              auVar81._16_16_ = auVar61;
              auVar81._0_16_ = auVar61;
              auVar78._16_16_ = auVar62;
              auVar78._0_16_ = auVar62;
              auVar47 = vsubps_avx(auVar53,auVar47);
              auVar48 = vsubps_avx(auVar54,auVar74);
              auVar49 = vsubps_avx(auVar55,auVar76);
              auVar50 = vsubps_avx(auVar77,auVar53);
              auVar60 = vsubps_avx(auVar81,auVar54);
              auVar59 = vsubps_avx(auVar78,auVar55);
              auVar52._4_4_ = auVar48._4_4_ * auVar59._4_4_;
              auVar52._0_4_ = auVar48._0_4_ * auVar59._0_4_;
              auVar52._8_4_ = auVar48._8_4_ * auVar59._8_4_;
              auVar52._12_4_ = auVar48._12_4_ * auVar59._12_4_;
              auVar52._16_4_ = auVar48._16_4_ * auVar59._16_4_;
              auVar52._20_4_ = auVar48._20_4_ * auVar59._20_4_;
              auVar52._24_4_ = auVar48._24_4_ * auVar59._24_4_;
              auVar52._28_4_ = auVar16._12_4_;
              auVar46 = vfmsub231ps_fma(auVar52,auVar60,auVar49);
              auVar26._4_4_ = auVar49._4_4_ * auVar50._4_4_;
              auVar26._0_4_ = auVar49._0_4_ * auVar50._0_4_;
              auVar26._8_4_ = auVar49._8_4_ * auVar50._8_4_;
              auVar26._12_4_ = auVar49._12_4_ * auVar50._12_4_;
              auVar26._16_4_ = auVar49._16_4_ * auVar50._16_4_;
              auVar26._20_4_ = auVar49._20_4_ * auVar50._20_4_;
              auVar26._24_4_ = auVar49._24_4_ * auVar50._24_4_;
              auVar26._28_4_ = auVar3._12_4_;
              auVar67 = vfmsub231ps_fma(auVar26,auVar59,auVar47);
              auVar27._4_4_ = auVar47._4_4_ * auVar60._4_4_;
              auVar27._0_4_ = auVar47._0_4_ * auVar60._0_4_;
              auVar27._8_4_ = auVar47._8_4_ * auVar60._8_4_;
              auVar27._12_4_ = auVar47._12_4_ * auVar60._12_4_;
              auVar27._16_4_ = auVar47._16_4_ * auVar60._16_4_;
              auVar27._20_4_ = auVar47._20_4_ * auVar60._20_4_;
              auVar27._24_4_ = auVar47._24_4_ * auVar60._24_4_;
              auVar27._28_4_ = auVar15._12_4_;
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
              auVar82._4_4_ = uVar1;
              auVar82._0_4_ = uVar1;
              auVar82._8_4_ = uVar1;
              auVar82._12_4_ = uVar1;
              auVar82._16_4_ = uVar1;
              auVar82._20_4_ = uVar1;
              auVar82._24_4_ = uVar1;
              auVar82._28_4_ = uVar1;
              auVar51 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
              auVar52 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
              uVar1 = *(undefined4 *)(ray + k * 4);
              auVar56._4_4_ = uVar1;
              auVar56._0_4_ = uVar1;
              auVar56._8_4_ = uVar1;
              auVar56._12_4_ = uVar1;
              auVar56._16_4_ = uVar1;
              auVar56._20_4_ = uVar1;
              auVar56._24_4_ = uVar1;
              auVar56._28_4_ = uVar1;
              auVar53 = vsubps_avx512vl(auVar53,auVar56);
              auVar2 = vfmsub231ps_fma(auVar27,auVar50,auVar48);
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
              auVar57._4_4_ = uVar1;
              auVar57._0_4_ = uVar1;
              auVar57._8_4_ = uVar1;
              auVar57._12_4_ = uVar1;
              auVar57._16_4_ = uVar1;
              auVar57._20_4_ = uVar1;
              auVar57._24_4_ = uVar1;
              auVar57._28_4_ = uVar1;
              auVar54 = vsubps_avx512vl(auVar54,auVar57);
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
              auVar58._4_4_ = uVar1;
              auVar58._0_4_ = uVar1;
              auVar58._8_4_ = uVar1;
              auVar58._12_4_ = uVar1;
              auVar58._16_4_ = uVar1;
              auVar58._20_4_ = uVar1;
              auVar58._24_4_ = uVar1;
              auVar58._28_4_ = uVar1;
              auVar55 = vsubps_avx512vl(auVar55,auVar58);
              auVar56 = vmulps_avx512vl(auVar51,auVar55);
              auVar56 = vfmsub231ps_avx512vl(auVar56,auVar54,auVar52);
              auVar57 = vmulps_avx512vl(auVar52,auVar53);
              auVar57 = vfmsub231ps_avx512vl(auVar57,auVar55,auVar82);
              auVar58 = vmulps_avx512vl(auVar82,auVar54);
              auVar58 = vfmsub231ps_avx512vl(auVar58,auVar53,auVar51);
              auVar52 = vmulps_avx512vl(ZEXT1632(auVar2),auVar52);
              auVar51 = vfmadd231ps_avx512vl(auVar52,ZEXT1632(auVar67),auVar51);
              local_1300 = vfmadd231ps_avx512vl(auVar51,ZEXT1632(auVar46),auVar82);
              vandps_avx512vl(local_1300,auVar99._0_32_);
              vandps_avx512vl(local_1300,auVar92._0_32_);
              auVar59 = vmulps_avx512vl(auVar59,auVar58);
              auVar60 = vfmadd231ps_avx512vl(auVar59,auVar57,auVar60);
              auVar50 = vfmadd231ps_avx512vl(auVar60,auVar56,auVar50);
              fVar64 = local_1300._0_4_;
              auVar79._0_4_ = (float)((uint)fVar64 ^ auVar50._0_4_);
              fVar69 = local_1300._4_4_;
              auVar79._4_4_ = (float)((uint)fVar69 ^ auVar50._4_4_);
              fVar70 = local_1300._8_4_;
              auVar79._8_4_ = (float)((uint)fVar70 ^ auVar50._8_4_);
              fVar71 = local_1300._12_4_;
              auVar79._12_4_ = (float)((uint)fVar71 ^ auVar50._12_4_);
              fVar83 = local_1300._16_4_;
              auVar79._16_4_ = (float)((uint)fVar83 ^ auVar50._16_4_);
              fVar84 = local_1300._20_4_;
              auVar79._20_4_ = (float)((uint)fVar84 ^ auVar50._20_4_);
              fVar85 = local_1300._24_4_;
              auVar79._24_4_ = (float)((uint)fVar85 ^ auVar50._24_4_);
              uVar86 = local_1300._28_4_;
              auVar79._28_4_ = (float)(uVar86 ^ auVar50._28_4_);
              auVar49 = vmulps_avx512vl(auVar49,auVar58);
              auVar48 = vfmadd231ps_avx512vl(auVar49,auVar48,auVar57);
              auVar47 = vfmadd231ps_avx512vl(auVar48,auVar47,auVar56);
              auVar87._0_4_ = (float)((uint)fVar64 ^ auVar47._0_4_);
              auVar87._4_4_ = (float)((uint)fVar69 ^ auVar47._4_4_);
              auVar87._8_4_ = (float)((uint)fVar70 ^ auVar47._8_4_);
              auVar87._12_4_ = (float)((uint)fVar71 ^ auVar47._12_4_);
              auVar87._16_4_ = (float)((uint)fVar83 ^ auVar47._16_4_);
              auVar87._20_4_ = (float)((uint)fVar84 ^ auVar47._20_4_);
              auVar87._24_4_ = (float)((uint)fVar85 ^ auVar47._24_4_);
              auVar87._28_4_ = (float)(uVar86 ^ auVar47._28_4_);
              uVar20 = vcmpps_avx512vl(auVar79,ZEXT832(0) << 0x20,5);
              uVar21 = vcmpps_avx512vl(auVar87,ZEXT832(0) << 0x20,5);
              uVar18 = vcmpps_avx512vl(local_1300,ZEXT832(0) << 0x20,4);
              auVar88._0_4_ = auVar79._0_4_ + auVar87._0_4_;
              auVar88._4_4_ = auVar79._4_4_ + auVar87._4_4_;
              auVar88._8_4_ = auVar79._8_4_ + auVar87._8_4_;
              auVar88._12_4_ = auVar79._12_4_ + auVar87._12_4_;
              auVar88._16_4_ = auVar79._16_4_ + auVar87._16_4_;
              auVar88._20_4_ = auVar79._20_4_ + auVar87._20_4_;
              auVar88._24_4_ = auVar79._24_4_ + auVar87._24_4_;
              auVar88._28_4_ = auVar79._28_4_ + auVar87._28_4_;
              uVar19 = vcmpps_avx512vl(auVar88,local_1300,2);
              local_12df = (byte)uVar20 & (byte)uVar21 & (byte)uVar18 & (byte)uVar19;
              if (local_12df != 0) {
                auVar28._4_4_ = auVar2._4_4_ * auVar55._4_4_;
                auVar28._0_4_ = auVar2._0_4_ * auVar55._0_4_;
                auVar28._8_4_ = auVar2._8_4_ * auVar55._8_4_;
                auVar28._12_4_ = auVar2._12_4_ * auVar55._12_4_;
                auVar28._16_4_ = auVar55._16_4_ * 0.0;
                auVar28._20_4_ = auVar55._20_4_ * 0.0;
                auVar28._24_4_ = auVar55._24_4_ * 0.0;
                auVar28._28_4_ = auVar55._28_4_;
                auVar3 = vfmadd213ps_fma(auVar54,ZEXT1632(auVar67),auVar28);
                auVar3 = vfmadd213ps_fma(auVar53,ZEXT1632(auVar46),ZEXT1632(auVar3));
                local_1320._0_4_ = (float)((uint)fVar64 ^ auVar3._0_4_);
                local_1320._4_4_ = (float)((uint)fVar69 ^ auVar3._4_4_);
                local_1320._8_4_ = (float)((uint)fVar70 ^ auVar3._8_4_);
                local_1320._12_4_ = (float)((uint)fVar71 ^ auVar3._12_4_);
                local_1320._16_4_ = fVar83;
                local_1320._20_4_ = fVar84;
                local_1320._24_4_ = fVar85;
                local_1320._28_4_ = uVar86;
                uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
                auVar23._4_4_ = uVar1;
                auVar23._0_4_ = uVar1;
                auVar23._8_4_ = uVar1;
                auVar23._12_4_ = uVar1;
                auVar23._16_4_ = uVar1;
                auVar23._20_4_ = uVar1;
                auVar23._24_4_ = uVar1;
                auVar23._28_4_ = uVar1;
                auVar47 = vmulps_avx512vl(local_1300,auVar23);
                uVar20 = vcmpps_avx512vl(auVar47,local_1320,1);
                uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
                auVar24._4_4_ = uVar1;
                auVar24._0_4_ = uVar1;
                auVar24._8_4_ = uVar1;
                auVar24._12_4_ = uVar1;
                auVar24._16_4_ = uVar1;
                auVar24._20_4_ = uVar1;
                auVar24._24_4_ = uVar1;
                auVar24._28_4_ = uVar1;
                auVar47 = vmulps_avx512vl(local_1300,auVar24);
                uVar21 = vcmpps_avx512vl(local_1320,auVar47,2);
                local_12df = (byte)uVar20 & (byte)uVar21 & local_12df;
                if (local_12df != 0) {
                  auVar47 = vsubps_avx(local_1300,auVar87);
                  auVar47 = vblendps_avx(auVar79,auVar47,0xf0);
                  auVar48 = vsubps_avx(local_1300,auVar79);
                  auVar48 = vblendps_avx(auVar87,auVar48,0xf0);
                  local_1260._0_4_ = auVar46._0_4_ * 1.0;
                  local_1260._4_4_ = auVar46._4_4_ * 1.0;
                  local_1260._8_4_ = auVar46._8_4_ * 1.0;
                  local_1260._12_4_ = auVar46._12_4_ * 1.0;
                  local_1260._16_4_ = 0x80000000;
                  local_1260._20_4_ = 0x80000000;
                  local_1260._24_4_ = 0x80000000;
                  local_1260._28_4_ = 0;
                  local_1240._4_4_ = auVar67._4_4_ * 1.0;
                  local_1240._0_4_ = auVar67._0_4_ * 1.0;
                  local_1240._8_4_ = auVar67._8_4_ * 1.0;
                  local_1240._12_4_ = auVar67._12_4_ * 1.0;
                  local_1240._16_4_ = 0x80000000;
                  local_1240._20_4_ = 0x80000000;
                  local_1240._24_4_ = 0x80000000;
                  local_1240._28_4_ = 0;
                  local_1220._4_4_ = auVar2._4_4_ * 1.0;
                  local_1220._0_4_ = auVar2._0_4_ * 1.0;
                  local_1220._8_4_ = auVar2._8_4_ * 1.0;
                  local_1220._12_4_ = auVar2._12_4_ * 1.0;
                  local_1220._16_4_ = 0x80000000;
                  local_1220._20_4_ = 0x80000000;
                  local_1220._24_4_ = 0x80000000;
                  local_1220._28_4_ = 0;
                  auVar73._8_4_ = 1;
                  auVar73._0_8_ = 0x100000001;
                  auVar73._12_4_ = 1;
                  auVar73._16_4_ = 1;
                  auVar73._20_4_ = 1;
                  auVar73._24_4_ = 1;
                  auVar73._28_4_ = 1;
                  auVar49 = vpermd_avx2(auVar73,ZEXT1632(auVar5));
                  auVar50 = vpaddd_avx2(auVar49,_DAT_0205d4e0);
                  auVar63._0_4_ = auVar5._0_4_;
                  auVar63._4_4_ = auVar63._0_4_;
                  auVar63._8_4_ = auVar63._0_4_;
                  auVar63._12_4_ = auVar63._0_4_;
                  auVar63._16_4_ = auVar63._0_4_;
                  auVar63._20_4_ = auVar63._0_4_;
                  auVar63._24_4_ = auVar63._0_4_;
                  auVar63._28_4_ = auVar63._0_4_;
                  auVar46 = vcvtsi2ss_avx512f(auVar89._0_16_,*(ushort *)(lVar7 + 8 + lVar34) - 1);
                  auVar49 = vpaddd_avx2(auVar63,_DAT_0205d4c0);
                  auVar14._12_4_ = 0;
                  auVar14._0_12_ = ZEXT812(0);
                  auVar67 = vrcp14ss_avx512f(auVar14 << 0x20,ZEXT416(auVar46._0_4_));
                  auVar46 = vfnmadd213ss_fma(auVar46,auVar67,SUB6416(ZEXT464(0x40000000),0));
                  fStack_1348 = auVar67._0_4_ * auVar46._0_4_;
                  auVar46 = vcvtsi2ss_avx512f(auVar89._0_16_,*(ushort *)(lVar7 + 10 + lVar34) - 1);
                  auVar67 = vrcp14ss_avx512f(auVar14 << 0x20,ZEXT416(auVar46._0_4_));
                  auVar46 = vfnmadd213ss_fma(auVar46,auVar67,SUB6416(ZEXT464(0x40000000),0));
                  fStack_1328 = auVar67._0_4_ * auVar46._0_4_;
                  auVar49 = vcvtdq2ps_avx(auVar49);
                  fStack_1344 = auVar49._28_4_ + auVar47._28_4_;
                  local_1360 = (fVar64 * auVar49._0_4_ + auVar47._0_4_) * fStack_1348;
                  fStack_135c = (fVar69 * auVar49._4_4_ + auVar47._4_4_) * fStack_1348;
                  fStack_1358 = (fVar70 * auVar49._8_4_ + auVar47._8_4_) * fStack_1348;
                  fStack_1354 = (fVar71 * auVar49._12_4_ + auVar47._12_4_) * fStack_1348;
                  fStack_1350 = (fVar83 * auVar49._16_4_ + auVar47._16_4_) * fStack_1348;
                  fStack_134c = (fVar84 * auVar49._20_4_ + auVar47._20_4_) * fStack_1348;
                  fStack_1348 = (fVar85 * auVar49._24_4_ + auVar47._24_4_) * fStack_1348;
                  auVar47 = vcvtdq2ps_avx(auVar50);
                  local_1340 = (fVar64 * auVar47._0_4_ + auVar48._0_4_) * fStack_1328;
                  fStack_133c = (fVar69 * auVar47._4_4_ + auVar48._4_4_) * fStack_1328;
                  fStack_1338 = (fVar70 * auVar47._8_4_ + auVar48._8_4_) * fStack_1328;
                  fStack_1334 = (fVar71 * auVar47._12_4_ + auVar48._12_4_) * fStack_1328;
                  fStack_1330 = (fVar83 * auVar47._16_4_ + auVar48._16_4_) * fStack_1328;
                  fStack_132c = (fVar84 * auVar47._20_4_ + auVar48._20_4_) * fStack_1328;
                  fStack_1328 = (fVar85 * auVar47._24_4_ + auVar48._24_4_) * fStack_1328;
                  fStack_1324 = auVar47._28_4_ + auVar48._28_4_;
                  if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_0086ac80;
                    auVar47 = vrcp14ps_avx512vl(local_1300);
                    auVar25._8_4_ = 0x3f800000;
                    auVar25._0_8_ = &DAT_3f8000003f800000;
                    auVar25._12_4_ = 0x3f800000;
                    auVar25._16_4_ = 0x3f800000;
                    auVar25._20_4_ = 0x3f800000;
                    auVar25._24_4_ = 0x3f800000;
                    auVar25._28_4_ = 0x3f800000;
                    auVar48 = vfnmadd213ps_avx512vl(local_1300,auVar47,auVar25);
                    auVar46 = vfmadd132ps_fma(auVar48,auVar47,auVar47);
                    fVar64 = auVar46._0_4_;
                    fVar69 = auVar46._4_4_;
                    fVar70 = auVar46._8_4_;
                    fVar71 = auVar46._12_4_;
                    local_1280[0] = fVar64 * local_1320._0_4_;
                    local_1280[1] = fVar69 * local_1320._4_4_;
                    local_1280[2] = fVar70 * local_1320._8_4_;
                    local_1280[3] = fVar71 * local_1320._12_4_;
                    fStack_1270 = fVar83 * 0.0;
                    fStack_126c = fVar84 * 0.0;
                    fStack_1268 = fVar85 * 0.0;
                    uStack_1264 = auVar47._28_4_;
                    local_12c0[0] = local_1360 * fVar64;
                    local_12c0[1] = fStack_135c * fVar69;
                    local_12c0[2] = fStack_1358 * fVar70;
                    local_12c0[3] = fStack_1354 * fVar71;
                    fStack_12b0 = fStack_1350 * 0.0;
                    fStack_12ac = fStack_134c * 0.0;
                    fStack_12a8 = fStack_1348 * 0.0;
                    fStack_12a4 = fStack_1344;
                    local_12a0[0] = local_1340 * fVar64;
                    local_12a0[1] = fStack_133c * fVar69;
                    local_12a0[2] = fStack_1338 * fVar70;
                    local_12a0[3] = fStack_1334 * fVar71;
                    fStack_1290 = fStack_1330 * 0.0;
                    fStack_128c = fStack_132c * 0.0;
                    fStack_1288 = fStack_1328 * 0.0;
                    fStack_1284 = fStack_1344;
                    puVar42 = (ulong *)(ulong)local_12df;
                    bVar45 = puVar42 == (ulong *)0x0;
                    if (!bVar45) {
                      local_1608 = 0;
                      for (puVar22 = puVar42; ((ulong)puVar22 & 1) == 0;
                          puVar22 = (ulong *)((ulong)puVar22 >> 1 | 0x8000000000000000)) {
                        local_1608 = local_1608 + 1;
                      }
                      local_1520 = vpbroadcastd_avx512vl();
                      auVar46 = vpbroadcastd_avx512vl();
                      local_1420 = auVar89._0_32_;
                      local_1440 = auVar90._0_32_;
                      local_1460 = auVar91._0_32_;
                      local_1480 = auVar93._0_32_;
                      local_14a0 = auVar94._0_32_;
                      local_14c0 = auVar95._0_32_;
                      local_14e0 = vmovdqa64_avx512vl(auVar96._0_32_);
                      local_1500 = vmovdqa64_avx512vl(auVar97._0_32_);
                      do {
                        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
                        local_13c0 = local_12c0[local_1608];
                        local_13b0 = local_12a0[local_1608];
                        *(float *)(ray + k * 4 + 0x80) = local_1280[local_1608];
                        local_1550.context = context->user;
                        local_13f0 = *(undefined4 *)(local_1260 + local_1608 * 4);
                        local_13e0 = *(undefined4 *)(local_1240 + local_1608 * 4);
                        local_13d0 = *(undefined4 *)(local_1220 + local_1608 * 4);
                        local_15f0 = auVar46._0_8_;
                        uStack_15e8 = auVar46._8_8_;
                        local_13a0 = local_15f0;
                        uStack_1398 = uStack_15e8;
                        local_1390 = local_1520;
                        vpcmpeqd_avx2(ZEXT1632(local_1520),ZEXT1632(local_1520));
                        uStack_137c = (local_1550.context)->instID[0];
                        local_1380 = uStack_137c;
                        uStack_1378 = uStack_137c;
                        uStack_1374 = uStack_137c;
                        uStack_1370 = (local_1550.context)->instPrimID[0];
                        uStack_136c = uStack_1370;
                        uStack_1368 = uStack_1370;
                        uStack_1364 = uStack_1370;
                        local_15e0 = local_1510._0_8_;
                        uStack_15d8 = local_1510._8_8_;
                        local_1550.valid = (int *)&local_15e0;
                        local_1550.geometryUserPtr = pGVar6->userPtr;
                        local_1550.hit = (RTCHitN *)&local_13f0;
                        local_1550.N = 4;
                        local_1550.ray = (RTCRayN *)ray;
                        uStack_13ec = local_13f0;
                        uStack_13e8 = local_13f0;
                        uStack_13e4 = local_13f0;
                        uStack_13dc = local_13e0;
                        uStack_13d8 = local_13e0;
                        uStack_13d4 = local_13e0;
                        uStack_13cc = local_13d0;
                        uStack_13c8 = local_13d0;
                        uStack_13c4 = local_13d0;
                        fStack_13bc = local_13c0;
                        fStack_13b8 = local_13c0;
                        fStack_13b4 = local_13c0;
                        fStack_13ac = local_13b0;
                        fStack_13a8 = local_13b0;
                        fStack_13a4 = local_13b0;
                        if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar6->occlusionFilterN)(&local_1550);
                        }
                        auVar15._8_8_ = uStack_15d8;
                        auVar15._0_8_ = local_15e0;
                        uVar36 = vptestmd_avx512vl(auVar15,auVar15);
                        if ((uVar36 & 0xf) != 0) {
                          p_Var9 = context->args->filter;
                          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var9)(&local_1550);
                          }
                          auVar16._8_8_ = uStack_15d8;
                          auVar16._0_8_ = local_15e0;
                          uVar36 = vptestmd_avx512vl(auVar16,auVar16);
                          uVar36 = uVar36 & 0xf;
                          auVar67 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar10 = (bool)((byte)uVar36 & 1);
                          bVar11 = (bool)((byte)(uVar36 >> 1) & 1);
                          bVar12 = (bool)((byte)(uVar36 >> 2) & 1);
                          bVar13 = SUB81(uVar36 >> 3,0);
                          *(uint *)(local_1550.ray + 0x80) =
                               (uint)bVar10 * auVar67._0_4_ |
                               (uint)!bVar10 * *(int *)(local_1550.ray + 0x80);
                          *(uint *)(local_1550.ray + 0x84) =
                               (uint)bVar11 * auVar67._4_4_ |
                               (uint)!bVar11 * *(int *)(local_1550.ray + 0x84);
                          *(uint *)(local_1550.ray + 0x88) =
                               (uint)bVar12 * auVar67._8_4_ |
                               (uint)!bVar12 * *(int *)(local_1550.ray + 0x88);
                          *(uint *)(local_1550.ray + 0x8c) =
                               (uint)bVar13 * auVar67._12_4_ |
                               (uint)!bVar13 * *(int *)(local_1550.ray + 0x8c);
                          if ((byte)uVar36 != 0) {
                            auVar89 = ZEXT3264(local_1420);
                            auVar90 = ZEXT3264(local_1440);
                            auVar91 = ZEXT3264(local_1460);
                            auVar47 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                            auVar92 = ZEXT3264(auVar47);
                            auVar93 = ZEXT3264(local_1480);
                            auVar94 = ZEXT3264(local_14a0);
                            auVar95 = ZEXT3264(local_14c0);
                            auVar47 = vmovdqa64_avx512vl(local_14e0);
                            auVar96 = ZEXT3264(auVar47);
                            auVar47 = vmovdqa64_avx512vl(local_1500);
                            auVar97 = ZEXT3264(auVar47);
                            auVar46 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
                            auVar98 = ZEXT1664(auVar46);
                            auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar99 = ZEXT3264(auVar47);
                            if (!bVar45) goto LAB_0086ac80;
                            break;
                          }
                        }
                        *(undefined4 *)(ray + k * 4 + 0x80) = uVar1;
                        uVar36 = local_1608 & 0x3f;
                        local_1608 = 0;
                        puVar42 = (ulong *)((ulong)puVar42 ^ 1L << uVar36);
                        for (puVar22 = puVar42; ((ulong)puVar22 & 1) == 0;
                            puVar22 = (ulong *)((ulong)puVar22 >> 1 | 0x8000000000000000)) {
                          local_1608 = local_1608 + 1;
                        }
                        bVar45 = puVar42 == (ulong *)0x0;
                        auVar89 = ZEXT3264(local_1420);
                        auVar90 = ZEXT3264(local_1440);
                        auVar91 = ZEXT3264(local_1460);
                        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar92 = ZEXT3264(auVar47);
                        auVar93 = ZEXT3264(local_1480);
                        auVar94 = ZEXT3264(local_14a0);
                        auVar95 = ZEXT3264(local_14c0);
                        auVar47 = vmovdqa64_avx512vl(local_14e0);
                        auVar96 = ZEXT3264(auVar47);
                        auVar47 = vmovdqa64_avx512vl(local_1500);
                        auVar97 = ZEXT3264(auVar47);
                        auVar67 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
                        auVar98 = ZEXT1664(auVar67);
                        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar99 = ZEXT3264(auVar47);
                      } while (!bVar45);
                    }
                  }
                }
              }
              uVar35 = uVar35 - 1 & uVar35;
            } while (uVar35 != 0);
          }
          local_1560 = local_1560 + 1;
          bVar44 = local_1560 < local_1568;
        } while (local_1560 != local_1568);
      }
LAB_0086ac80:
      uVar86 = 0;
      uVar35 = local_15a8;
      uVar36 = local_15b0;
      uVar37 = local_15b8;
      uVar38 = local_15c0;
      uVar39 = local_15c8;
      uVar43 = local_15d0;
      if (bVar44) {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        uVar86 = 1;
      }
    }
    puVar42 = local_1618;
  } while ((uVar86 & 3) == 0);
  return puVar31 != &local_1200;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }